

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O0

Vector __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::measureDynamics
          (StableIMUFixedContactDynamicalSystem *this,Vector *x,Vector *u,TimeIndex k)

{
  double *pdVar1;
  QuaternionBase<Eigen::Quaternion<double,_0>_> *this_00;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *other;
  QuaternionBase<Eigen::Quaternion<double,_0>_> *other_00;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *other_01;
  Index IVar2;
  ulong uVar3;
  size_type sVar4;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar5;
  Matrix<double,_3,_3,_0,_3,_3> *x_00;
  Index extraout_RDX;
  double in_R8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar6;
  Vector VVar7;
  Type local_a68;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_a30;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_a20;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_a00;
  uint local_9c4;
  undefined1 local_9c0 [4];
  uint i;
  undefined1 local_988 [47];
  undefined1 local_959;
  Type local_958;
  Type local_920;
  Type local_8e8;
  ConstantReturnType local_8a8;
  undefined1 local_890 [8];
  Vector v;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_870;
  Matrix<double,3,1,0,3,1> local_850 [8];
  Vector3 angularVelocity;
  StorageBaseType local_828 [76];
  int local_7dc;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_7d8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_7b0;
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_780;
  tools local_748 [72];
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_700 [72];
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> local_6b8 [72];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_670;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_658;
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_638;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_610;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_5a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_518;
  Matrix<double,3,1,0,3,1> local_470 [8];
  Vector3 acceleration;
  Quaternion q;
  Quaternion qControl;
  Type local_410;
  Matrix<double,3,1,0,3,1> local_3d8 [8];
  Vector3 angularVelocityControl;
  Matrix<double,3,1,0,3,1> local_388 [8];
  Vector3 orientationControlV;
  Matrix<double,3,1,0,3,1> local_338 [8];
  Vector3 accelerationControl;
  Matrix<double,3,1,0,3,1> local_2e8 [8];
  Vector3 velocityControl;
  Matrix<double,3,1,0,3,1> local_298 [8];
  Vector3 positionControl;
  Matrix3 rFlex;
  Quaternion qFlex;
  Type local_210;
  Matrix<double,3,1,0,3,1> local_1d8 [8];
  Vector3 angularAccelerationFlex;
  Matrix<double,3,1,0,3,1> local_188 [8];
  Vector3 angularVelocityFlex;
  Matrix<double,3,1,0,3,1> local_138 [8];
  Vector3 orientationFlexV;
  Matrix<double,3,1,0,3,1> local_e8 [8];
  Vector3 accelerationFlex;
  Matrix<double,3,1,0,3,1> local_98 [8];
  Vector3 velocityFlex;
  Matrix<double,3,1,0,3,1> local_48 [8];
  Vector3 positionFlex;
  TimeIndex k_local;
  Vector *u_local;
  Vector *x_local;
  StableIMUFixedContactDynamicalSystem *this_local;
  Vector *y;
  
  positionFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = in_R8;
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,u);
  pdVar1 = velocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,0,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_48,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = accelerationFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,6,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_98,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,0xc,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_e8,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,3,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_138,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = angularAccelerationFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,9,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_188,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_210,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,0xf,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>(local_1d8,&local_210);
  this_00 = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
            (rFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array + 8);
  computeQuaternion_((Quaternion *)this_00,(StableIMUFixedContactDynamicalSystem *)x,
                     (Vector3 *)local_138);
  other = (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
          (positionControl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::toRotationMatrix((Matrix3 *)other,this_00);
  DynamicalSystemFunctorBase::assertInputVector_((DynamicalSystemFunctorBase *)x,(Vector *)k);
  pdVar1 = velocityControl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)k,0,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_298,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = accelerationControl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)k,6,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_2e8,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = orientationControlV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)k,0xc,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_338,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  pdVar1 = angularVelocityControl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 2;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)pdVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)k,3,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>
            (local_388,(VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)pdVar1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_410,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)k,9,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>const,_1>>(local_3d8,&local_410);
  other_00 = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array + 3);
  computeQuaternion_((Quaternion *)other_00,(StableIMUFixedContactDynamicalSystem *)x,
                     (Vector3 *)local_388);
  pdVar1 = acceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array + 2;
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)pdVar1,(QuaternionBase<Eigen::Quaternion<double,0>> *)this_00,
             other_00);
  kine::skewSymmetric((Matrix3 *)local_6b8,(Vector3 *)local_1d8);
  kine::skewSymmetric((Matrix3 *)local_748,(Vector3 *)local_188);
  tools::square<Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_700,local_748,x_00);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+(&local_670,local_6b8,local_700);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(&local_658,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
               *)&local_670,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(&local_638,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
               *)&local_658,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_298);
  local_7dc = 2;
  kine::skewSymmetric((Matrix3 *)local_828,(Vector3 *)local_188);
  Eigen::operator*(&local_7d8,&local_7dc,local_828);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(&local_7b0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
               *)&local_7d8,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(&local_780,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
               *)&local_7b0,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_2e8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator+(&local_610,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
               *)&local_638,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)&local_780);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
  ::operator+(&local_5a0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
               *)&local_610,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_e8);
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                 (other,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_338);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator+(&local_518,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
               *)&local_5a0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)(angularVelocity.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            (local_470,&local_518);
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                 (other,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_3d8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (&local_870,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_188,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            (local_850,&local_870);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_8a8,10,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_890,&local_8a8);
  other_01 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             Eigen::Quaternion<double,_0>::coeffs((Quaternion<double,_0> *)pdVar1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<4>
            (&local_8e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_890,4);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,4,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,4,1,false> *)&local_8e8,other_01);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_920,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_890,4,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_920,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_470);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
            (&local_958,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_890,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_958,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_850);
  AlgebraicSensor::setState
            ((AlgebraicSensor *)
             &(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
             (Vector *)local_890,
             (TimeIndex)
             positionFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2]);
  local_959 = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)(local_988 + 0x10),
             x[0x16].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)(local_988 + 0x10));
  AlgebraicSensor::getMeasurements((AlgebraicSensor *)local_988,(bool)((char)x + '\b'));
  IVar2 = AlgebraicSensor::getMeasurementSize
                    ((AlgebraicSensor *)
                     &(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
            ((Type *)local_9c0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,IVar2);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)local_9c0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_988);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_988);
  local_9c4 = 0;
  while( true ) {
    uVar3 = (ulong)local_9c4;
    sVar4 = std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)(x + 0x17));
    if (sVar4 <= uVar3) break;
    pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)(x + 0x17),(ulong)local_9c4);
    PVar6 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                       (positionControl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        .m_storage.m_data.array + 2),pMVar5);
    local_a30 = PVar6;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
    operator+(&local_a20,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
               *)&local_a30,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_48);
    pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           *)(x + 0x17),(ulong)local_9c4);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator-(&local_a00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                 *)&local_a20,pMVar5);
    IVar2 = AlgebraicSensor::getMeasurementSize
                      ((AlgebraicSensor *)
                       &(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_a68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
               IVar2 + (ulong)(local_9c4 * 3),3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_a68,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_a00);
    local_9c4 = local_9c4 + 1;
  }
  local_959 = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_890);
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector StableIMUFixedContactDynamicalSystem::measureDynamics(const Vector & x, const Vector & u, TimeIndex k)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  Vector3 accelerationFlex(x.segment(indexes::linAcc, 3));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  Vector3 angularAccelerationFlex(x.segment(indexes::angAcc, 3));

  Quaternion qFlex(computeQuaternion_(orientationFlexV));
  Matrix3 rFlex(qFlex.toRotationMatrix());

  assertInputVector_(u);

  Vector3 positionControl(u.segment(indexes::pos, 3));
  Vector3 velocityControl(u.segment(indexes::linVel, 3));
  Vector3 accelerationControl(u.segment(indexes::linAcc, 3));

  Vector3 orientationControlV(u.segment(indexes::ori, 3));
  Vector3 angularVelocityControl(u.segment(indexes::angVel, 3));

  Quaternion qControl(computeQuaternion_(orientationControlV));

  Quaternion q = qFlex * qControl;

  Vector3 acceleration(
      (kine::skewSymmetric(angularAccelerationFlex) + tools::square(kine::skewSymmetric(angularVelocityFlex))) * rFlex
          * positionControl
      + 2 * kine::skewSymmetric(angularVelocityFlex) * rFlex * velocityControl + accelerationFlex
      + rFlex * accelerationControl);

  Vector3 angularVelocity(angularVelocityFlex + rFlex * angularVelocityControl);

  Vector v(Vector::Zero(10, 1));

  v.head<4>() = q.coeffs();

  v.segment(4, 3) = acceleration;
  v.tail(3) = angularVelocity;

  sensor_.setState(v, k);

  Vector y(Matrix::Zero(measurementSize_, 1));

  y.head(sensor_.getMeasurementSize()) = sensor_.getMeasurements();

  for(unsigned i = 0; i < contactPositions_.size(); ++i)
  {
    y.segment(sensor_.getMeasurementSize() + i * 3, 3) =
        rFlex * contactPositions_[i] + positionFlex - contactPositions_[i];
  }

  return y;
}